

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequenceDistanceGraphPath.cc
# Opt level: O2

ostream * operator<<(ostream *os,SequenceDistanceGraphPath *sdgp)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(os,"SequenceDistanceGraphPath (");
  poVar1 = std::operator<<(poVar1,(string *)&(sdgp->sg->super_DistanceGraph).name);
  poVar1 = std::operator<<(poVar1,"): ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1," nodes");
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const SequenceDistanceGraphPath &sdgp) {
    os << "SequenceDistanceGraphPath (" << sdgp.sg.name << "): " << sdgp.nodes.size() << " nodes";
    return os;
}